

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

string * __thiscall
BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameWithClusterInfo *this)

{
  BayesianGameIdenticalPayoff *this_00;
  value_type pvVar1;
  element_type *peVar2;
  pointer puVar3;
  JointBeliefInterface *pJVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  const_reference ppvVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  undefined4 extraout_var_00;
  pointer ppTVar9;
  pointer ppJVar10;
  pointer puVar11;
  ulong uVar12;
  uint uVar13;
  ulong __n;
  stringstream ss;
  stringstream ss_1;
  size_type local_548;
  char *local_538;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [12];
  stringstream local_340 [16];
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_340);
  poVar6 = std::operator<<(local_330,"Previous joint policy:");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_538 = "There is no previous BG or BG-policy";
  if (((this->_m_pBGJPol).px != (element_type *)0x0) && ((this->_m_pBG).px != (element_type *)0x0))
  {
    uVar13 = 0;
    local_538 = "that lead to the following BG:";
    while( true ) {
      iVar5 = (*(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[3])();
      __n = (ulong)uVar13;
      if (CONCAT44(extraout_var,iVar5) <= __n) break;
      poVar6 = std::operator<<(local_330,"agI=");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::endl<char,std::char_traits<char>>(poVar6);
      ppvVar7 = std::
                vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ::at(&((this->_m_pBG).px)->_m_typeLists,__n);
      pvVar1 = *ppvVar7;
      uVar12 = 0;
      for (ppTVar9 = (pvVar1->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          ppTVar9 !=
          (pvVar1->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
          super__Vector_impl_data._M_finish; ppTVar9 = ppTVar9 + 1) {
        poVar6 = std::operator<<(local_330,"tI ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," - ");
        TypeCluster::SoftPrint_abi_cxx11_(local_4c8,*ppTVar9);
        poVar6 = std::operator<<(poVar6,(string *)local_4c8);
        poVar6 = std::operator<<(poVar6," Action: ");
        peVar2 = (this->_m_pBGJPol).px;
        (*(peVar2->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x13])
                  (peVar2,__n,uVar12);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string((string *)local_4c8);
        uVar12 = (ulong)((int)uVar12 + 1);
      }
      uVar13 = uVar13 + 1;
    }
  }
  poVar6 = std::operator<<(local_330,local_538);
  std::endl<char,std::char_traits<char>>(poVar6);
  BayesianGameForDecPOMDPStage::SoftPrint_abi_cxx11_
            (local_4c8,&this->super_BayesianGameForDecPOMDPStage);
  std::operator<<(local_330,(string *)local_4c8);
  std::__cxx11::string::~string((string *)local_4c8);
  poVar6 = std::operator<<(local_330,"This BG is clustered/clusterable.");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(local_330,"Joint beliefs assoc. with each joint type:");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_548 = 0;
  this_00 = &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
  for (ppJVar10 = (this->super_BayesianGameForDecPOMDPStage)._m_JBs.
                  super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppJVar10 !=
      (this->super_BayesianGameForDecPOMDPStage)._m_JBs.
      super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppJVar10 = ppJVar10 + 1) {
    poVar6 = std::operator<<(local_330,"jtI=");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"=");
    pvVar8 = BayesianGameBase::JointToIndividualTypeIndices
                       ((BayesianGameBase *)this_00,(Index)local_548);
    std::__cxx11::stringstream::stringstream(local_1b8);
    puVar11 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    std::operator<<(local_1a8,"< ");
    for (; puVar11 != puVar3; puVar11 = puVar11 + 1) {
      if (puVar11 !=
          (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        std::operator<<(local_1a8,", ");
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_4c8[0].field_2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
      std::operator<<(local_1a8,local_4e8);
      std::__cxx11::string::~string(local_4e8);
    }
    std::operator<<(local_1a8," >");
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    poVar6 = std::operator<<(poVar6,local_508);
    poVar6 = std::operator<<(poVar6,", repres. jaohI=");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->_m_jaohReps,local_548);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,", jb=");
    pJVar4 = *ppJVar10;
    (**(code **)(*(long *)((long)&pJVar4->field_0x0 + *(long *)((long)*pJVar4 + -0xb8)) + 0x60))
              (local_4c8,(long)&pJVar4->field_0x0 + *(long *)((long)*pJVar4 + -0xb8));
    poVar6 = std::operator<<(poVar6,(string *)local_4c8);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)local_4c8);
    std::__cxx11::string::~string(local_508);
    local_548 = (size_type)((Index)local_548 + 1);
  }
  poVar6 = std::operator<<(local_330,"Type lists of agents:");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_548 = 0;
  while( true ) {
    iVar5 = (*(this_00->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])();
    if (CONCAT44(extraout_var_00,iVar5) <= local_548) break;
    poVar6 = std::operator<<(local_330,"agI=");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,", types:");
    std::endl<char,std::char_traits<char>>(poVar6);
    ppvVar7 = std::
              vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
              ::at(&this->_m_typeLists,local_548);
    pvVar1 = *ppvVar7;
    for (ppTVar9 = (pvVar1->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar9 !=
        (pvVar1->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppTVar9 = ppTVar9 + 1) {
      poVar6 = std::operator<<(local_330,"tI ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," - ");
      TypeCluster::SoftPrint_abi_cxx11_(local_4c8,*ppTVar9);
      poVar6 = std::operator<<(poVar6,(string *)local_4c8);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)local_4c8);
    }
    local_548 = (size_type)((int)local_548 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameWithClusterInfo::SoftPrint() const
{
    stringstream ss;
    ss << "Previous joint policy:"<<endl;
    if(_m_pBGJPol != 0 && _m_pBG != 0)
    {
        for(Index agI=0; agI < GetNrAgents(); agI++)
        {
            ss << "agI=" << agI <<endl;
            TypeClusterList* tl = _m_pBG->_m_typeLists.at(agI);
            {
                Index i=0;
                for(TypeClusterList::const_iterator it = tl->begin();
                        it != tl->end(); it++, i++)
                {
                    ss << "tI "<< i << " - " << (*it)->SoftPrint() 
                        << " Action: " << _m_pBGJPol->GetActionIndex(agI, i)
                        << endl;

                }
            }
        }
        ss << "that lead to the following BG:"<<endl;
    }
    else
        ss << "There is no previous BG or BG-policy"<<endl;



    ss << BayesianGameForDecPOMDPStage::SoftPrint(); 
    ss << "This BG is clustered/clusterable."<<endl;
    ss << "Joint beliefs assoc. with each joint type:"<<endl;
    {
        Index i=0;
        for(vector< JointBeliefInterface* >::const_iterator it=_m_JBs.begin(); 
                it != _m_JBs.end(); it++, i++)
        {
            ss << "jtI="<<i
                << "=" << PrintTools::SoftPrintVector(
                        JointToIndividualTypeIndices(i)
                        )
                << ", repres. jaohI="<< _m_jaohReps.at(i)
            //GetPUDecPOMDPDiscrete()->GetJointActionObservationHistoryTree(_m_jaohReps.at(i))->
                    //GetJointActionObservationHistory()->
                    //SoftPrintJointIndicesconst()
                <<", jb="<< (*it)->SoftPrint() 
            << endl;
        }
    }
    ss << "Type lists of agents:"<<endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        ss << "agI=" << agI << ", types:"<<endl;
        TypeClusterList* tl = _m_typeLists.at(agI);
        {
            Index i=0;
            for(TypeClusterList::const_iterator it = tl->begin();
                    it != tl->end(); it++, i++)
            {
                ss << "tI "<< i << " - " << (*it)->SoftPrint() << endl;
            }
        }
    }

    return(ss.str());
}